

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<std::_Rb_tree_const_iterator<std::pair<int,int>>>
               (_Rb_tree_const_iterator<std::pair<int,_int>_> *value,ostream *os)

{
  ostream *os_local;
  _Rb_tree_const_iterator<std::pair<int,_int>_> *value_local;
  
  RawBytesPrinter::PrintValue<std::_Rb_tree_const_iterator<std::pair<int,int>>,8ul>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}